

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

void Liby::Resolver::async_resolve(string *host,string *service,ResolverHandler *handler)

{
  ResolverHandler *port;
  string *name;
  int iVar1;
  EventLoop *loop_00;
  function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)> local_58;
  EventLoop *local_38;
  EventLoop *loop;
  ResolverHandler *local_20;
  ResolverHandler *handler_local;
  string *service_local;
  string *host_local;
  
  local_20 = handler;
  handler_local = (ResolverHandler *)service;
  service_local = host;
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::rt == '\0') {
    iVar1 = __cxa_guard_acquire(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                                 ::rt);
    if (iVar1 != 0) {
      ResolverThread::ResolverThread(&async_resolve::rt);
      __cxa_atexit(ResolverThread::~ResolverThread,&async_resolve::rt,&__dso_handle);
      __cxa_guard_release(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                           ::rt);
    }
  }
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::ri == '\0') {
    iVar1 = __cxa_guard_acquire(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                                 ::ri);
    if (iVar1 != 0) {
      ResolverImp::ResolverImp(&async_resolve::ri,&async_resolve::rt);
      __cxa_atexit(ResolverImp::~ResolverImp,&async_resolve::ri,&__dso_handle);
      __cxa_guard_release(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                           ::ri);
    }
  }
  loop_00 = EventLoop::curr_thread_loop();
  name = service_local;
  port = handler_local;
  local_38 = loop_00;
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  function(&local_58,local_20);
  ResolverThread::resolve(&async_resolve::rt,name,(string *)port,loop_00,&local_58);
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  ~function(&local_58);
  return;
}

Assistant:

void Resolver::async_resolve(const std::string &host,
                             const std::string &service,
                             const ResolverHandler &handler) {
    static ResolverThread rt;
    static ResolverImp ri(rt);

    EventLoop *loop = EventLoop::curr_thread_loop();
    rt.resolve(host, service, loop, handler);
}